

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

void cmsys::SystemTools::SplitPath
               (string *p,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *components,bool expand_home_dir)

{
  char *__beg;
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  allocator<char> local_f9;
  value_type local_f8;
  allocator<char> local_d1;
  value_type local_d0;
  char *local_b0;
  char *last;
  char *first;
  passwd *pw;
  undefined1 local_78 [8];
  string homedir;
  undefined1 local_48 [8];
  string root;
  char *c;
  bool expand_home_dir_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *components_local;
  string *p_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(components);
  std::__cxx11::string::string((string *)local_48);
  root.field_2._8_8_ = SplitPathRootComponent(p,(string *)local_48);
  if (((expand_home_dir) && (uVar1 = std::__cxx11::string::empty(), (uVar1 & 1) == 0)) &&
     (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_48), *pcVar2 == '~')) {
    std::__cxx11::string::string((string *)local_78);
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&pw,(ulong)local_48);
    std::__cxx11::string::operator=((string *)local_48,(string *)&pw);
    std::__cxx11::string::~string((string *)&pw);
    lVar3 = std::__cxx11::string::size();
    if (lVar3 == 1) {
      GetEnv("HOME",(string *)local_78);
    }
    else {
      lVar3 = std::__cxx11::string::c_str();
      first = (char *)getpwnam((char *)(lVar3 + 1));
      if (((passwd *)first != (passwd *)0x0) && (((passwd *)first)->pw_dir != (char *)0x0)) {
        std::__cxx11::string::operator=((string *)local_78,((passwd *)first)->pw_dir);
      }
    }
    uVar1 = std::__cxx11::string::empty();
    if (((uVar1 & 1) == 0) &&
       ((pcVar2 = (char *)std::__cxx11::string::back(), *pcVar2 == '/' ||
        (pcVar2 = (char *)std::__cxx11::string::back(), *pcVar2 == '\\')))) {
      std::__cxx11::string::size();
      std::__cxx11::string::resize((ulong)local_78);
    }
    SplitPath((string *)local_78,components,true);
    std::__cxx11::string::~string((string *)local_78);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(components,(value_type *)local_48);
  }
  std::__cxx11::string::~string((string *)local_48);
  last = (char *)root.field_2._8_8_;
  for (local_b0 = (char *)root.field_2._8_8_; __beg = last, pcVar2 = local_b0, *local_b0 != '\0';
      local_b0 = local_b0 + 1) {
    if ((*local_b0 == '/') || (*local_b0 == '\\')) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>((string *)&local_d0,__beg,pcVar2,&local_d1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(components,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator(&local_d1);
      last = local_b0 + 1;
    }
  }
  if (local_b0 != (char *)root.field_2._8_8_) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>((string *)&local_f8,__beg,pcVar2,&local_f9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(components,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
  }
  return;
}

Assistant:

void SystemTools::SplitPath(const std::string& p,
                            std::vector<std::string>& components,
                            bool expand_home_dir)
{
  const char* c;
  components.clear();

  // Identify the root component.
  {
    std::string root;
    c = SystemTools::SplitPathRootComponent(p, &root);

    // Expand home directory references if requested.
    if (expand_home_dir && !root.empty() && root[0] == '~') {
      std::string homedir;
      root = root.substr(0, root.size() - 1);
      if (root.size() == 1) {
#if defined(_WIN32) && !defined(__CYGWIN__)
        if (!SystemTools::GetEnv("USERPROFILE", homedir))
#endif
          SystemTools::GetEnv("HOME", homedir);
      }
#ifdef HAVE_GETPWNAM
      else if (passwd* pw = getpwnam(root.c_str() + 1)) {
        if (pw->pw_dir) {
          homedir = pw->pw_dir;
        }
      }
#endif
      if (!homedir.empty() &&
          (homedir.back() == '/' || homedir.back() == '\\')) {
        homedir.resize(homedir.size() - 1);
      }
      SystemTools::SplitPath(homedir, components);
    } else {
      components.push_back(root);
    }
  }

  // Parse the remaining components.
  const char* first = c;
  const char* last = first;
  for (; *last; ++last) {
    if (*last == '/' || *last == '\\') {
      // End of a component.  Save it.
      components.push_back(std::string(first, last));
      first = last + 1;
    }
  }

  // Save the last component unless there were no components.
  if (last != c) {
    components.push_back(std::string(first, last));
  }
}